

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# macro.cpp
# Opt level: O1

void macro_SetUniqueID(uint32_t id)

{
  char *pcVar1;
  
  uniqueID = id;
  if (id + 1 < 2) {
    pcVar1 = (char *)0x0;
  }
  else {
    pcVar1 = uniqueIDBuf;
    sprintf(uniqueIDBuf,"_u%u");
  }
  uniqueIDPtr = pcVar1;
  return;
}

Assistant:

void macro_SetUniqueID(uint32_t id)
{
	uniqueID = id;
	if (id == 0 || id == (uint32_t)-1) {
		uniqueIDPtr = NULL;
	} else {
		// The buffer is guaranteed to be the correct size
		// This is a valid label fragment, but not a valid numeric
		sprintf(uniqueIDBuf, "_u%" PRIu32, id);
		uniqueIDPtr = uniqueIDBuf;
	}
}